

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::descriptor_unittest::DescriptorTest_FieldLabel_Test::TestBody
          (DescriptorTest_FieldLabel_Test *this)

{
  byte bVar1;
  bool bVar2;
  undefined8 extraout_RAX;
  byte bVar3;
  int iVar4;
  internal iVar5;
  char *pcVar6;
  char *in_R9;
  FieldDescriptor *this_00;
  AssertHelper local_50;
  undefined1 local_48 [8];
  DescriptorNames local_40;
  AssertHelper local_38;
  string local_30;
  
  local_50.data_._0_4_ = 2;
  this_00 = (this->super_DescriptorTest).foo_;
  bVar2 = FieldDescriptor::is_required(this_00);
  iVar4 = 2;
  if (bVar2) {
LAB_00578365:
    local_30._M_dataplus._M_p._0_4_ = iVar4;
    testing::internal::
    CmpHelperEQ<google::protobuf::internal::FieldDescriptorLite::Label,google::protobuf::internal::FieldDescriptorLite::Label>
              ((internal *)local_48,"FieldDescriptor::LABEL_REQUIRED","foo_->label()",
               (Label *)&local_50,(Label *)&local_30);
    if ((internal)local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_30);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40.payload_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar6 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar6 = *local_40.payload_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0x4ca,pcVar6);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_30);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      if ((long *)CONCAT44(local_30._M_dataplus._M_p._4_4_,(int)local_30._M_dataplus._M_p) !=
          (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_30._M_dataplus._M_p._4_4_,
                                       (int)local_30._M_dataplus._M_p) + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40.payload_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_40,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_40.payload_);
    }
    local_50.data_._0_4_ = 1;
    this_00 = (this->super_DescriptorTest).bar_;
    bVar2 = FieldDescriptor::is_required(this_00);
    iVar4 = 2;
    if (!bVar2) {
      bVar2 = (bool)((this_00->field_0x1 & 0x20) >> 5);
      if (0xbf < (byte)this_00->field_0x1 == bVar2) {
        iVar4 = (uint)bVar2 * 2 + 1;
        goto LAB_0057844e;
      }
      goto LAB_00578e84;
    }
LAB_0057844e:
    local_30._M_dataplus._M_p._0_4_ = iVar4;
    testing::internal::
    CmpHelperEQ<google::protobuf::internal::FieldDescriptorLite::Label,google::protobuf::internal::FieldDescriptorLite::Label>
              ((internal *)local_48,"FieldDescriptor::LABEL_OPTIONAL","bar_->label()",
               (Label *)&local_50,(Label *)&local_30);
    if ((internal)local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_30);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40.payload_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar6 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar6 = *local_40.payload_;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_50,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0x4cb,pcVar6);
      testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_30);
      testing::internal::AssertHelper::~AssertHelper(&local_50);
      if ((long *)CONCAT44(local_30._M_dataplus._M_p._4_4_,(int)local_30._M_dataplus._M_p) !=
          (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_30._M_dataplus._M_p._4_4_,
                                       (int)local_30._M_dataplus._M_p) + 8))();
      }
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40.payload_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_40,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_40.payload_);
    }
    local_50.data_._0_4_ = 3;
    this_00 = (this->super_DescriptorTest).baz_;
    bVar2 = FieldDescriptor::is_required(this_00);
    iVar4 = 2;
    if (bVar2) {
LAB_00578537:
      local_30._M_dataplus._M_p._0_4_ = iVar4;
      testing::internal::
      CmpHelperEQ<google::protobuf::internal::FieldDescriptorLite::Label,google::protobuf::internal::FieldDescriptorLite::Label>
                ((internal *)local_48,"FieldDescriptor::LABEL_REPEATED","baz_->label()",
                 (Label *)&local_50,(Label *)&local_30);
      if ((internal)local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_30);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40.payload_
            == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar6 = anon_var_dwarf_a22956 + 5;
        }
        else {
          pcVar6 = *local_40.payload_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                   ,0x4cc,pcVar6);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_30);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if ((long *)CONCAT44(local_30._M_dataplus._M_p._4_4_,(int)local_30._M_dataplus._M_p) !=
            (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_30._M_dataplus._M_p._4_4_,
                                         (int)local_30._M_dataplus._M_p) + 8))();
        }
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40.payload_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_40,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_40.payload_);
      }
      local_50.data_._0_4_ = 1;
      this_00 = (this->super_DescriptorTest).moo_;
      bVar2 = FieldDescriptor::is_required(this_00);
      iVar4 = 2;
      if (!bVar2) {
        bVar2 = (bool)((this_00->field_0x1 & 0x20) >> 5);
        if (0xbf < (byte)this_00->field_0x1 != bVar2) goto LAB_00578eb0;
        iVar4 = (uint)bVar2 * 2 + 1;
      }
      this_00 = (FieldDescriptor *)local_48;
      local_30._M_dataplus._M_p._0_4_ = iVar4;
      testing::internal::
      CmpHelperEQ<google::protobuf::internal::FieldDescriptorLite::Label,google::protobuf::internal::FieldDescriptorLite::Label>
                ((internal *)this_00,"FieldDescriptor::LABEL_OPTIONAL","moo_->label()",
                 (Label *)&local_50,(Label *)&local_30);
      if ((internal)local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_30);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40.payload_
            == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar6 = anon_var_dwarf_a22956 + 5;
        }
        else {
          pcVar6 = *local_40.payload_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                   ,0x4cd,pcVar6);
        testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_30);
        testing::internal::AssertHelper::~AssertHelper(&local_50);
        if ((long *)CONCAT44(local_30._M_dataplus._M_p._4_4_,(int)local_30._M_dataplus._M_p) !=
            (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_30._M_dataplus._M_p._4_4_,
                                         (int)local_30._M_dataplus._M_p) + 8))();
        }
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40.payload_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_40,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_40.payload_);
      }
      local_48[0] = FieldDescriptor::is_required((this->super_DescriptorTest).foo_);
      local_40.payload_ = (char *)0x0;
      if (!(bool)local_48[0]) {
        this_00 = (FieldDescriptor *)&local_40;
        testing::Message::Message((Message *)&local_50);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_30,(internal *)local_48,(AssertionResult *)"foo_->is_required()","false",
                   "true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_38,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                   ,0x4cf,(char *)CONCAT44(local_30._M_dataplus._M_p._4_4_,
                                           (int)local_30._M_dataplus._M_p));
        testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_50);
        testing::internal::AssertHelper::~AssertHelper(&local_38);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_30._M_dataplus._M_p._4_4_,(int)local_30._M_dataplus._M_p) !=
            &local_30.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_30._M_dataplus._M_p._4_4_,(int)local_30._M_dataplus._M_p),
                          local_30.field_2._M_allocated_capacity + 1);
        }
        if ((long *)CONCAT44(local_50.data_._4_4_,local_50.data_._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_50.data_._4_4_,local_50.data_._0_4_) + 8))();
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40.payload_
            != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)this_00,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_40.payload_);
        }
      }
      local_48[0] = (((this->super_DescriptorTest).foo_)->field_0x1 & 0xc0) != 0x40;
      local_40.payload_ = (char *)0x0;
      if (!(bool)local_48[0]) {
        this_00 = (FieldDescriptor *)&local_40;
        testing::Message::Message((Message *)&local_50);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_30,(internal *)local_48,(AssertionResult *)"foo_->is_optional()","true",
                   "false",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_38,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                   ,0x4d0,(char *)CONCAT44(local_30._M_dataplus._M_p._4_4_,
                                           (int)local_30._M_dataplus._M_p));
        testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_50);
        testing::internal::AssertHelper::~AssertHelper(&local_38);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_30._M_dataplus._M_p._4_4_,(int)local_30._M_dataplus._M_p) !=
            &local_30.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_30._M_dataplus._M_p._4_4_,(int)local_30._M_dataplus._M_p),
                          local_30.field_2._M_allocated_capacity + 1);
        }
        if ((long *)CONCAT44(local_50.data_._4_4_,local_50.data_._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_50.data_._4_4_,local_50.data_._0_4_) + 8))();
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40.payload_
            != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)this_00,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_40.payload_);
        }
      }
      bVar1 = ((this->super_DescriptorTest).foo_)->field_0x1;
      if (0xbf < bVar1 == (bool)((bVar1 & 0x20) >> 5)) {
        local_48[0] = (bVar1 & 0x20) == 0;
        local_40.payload_ = (char *)0x0;
        if (!(bool)local_48[0]) {
          this_00 = (FieldDescriptor *)&local_40;
          testing::Message::Message((Message *)&local_50);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_30,(internal *)local_48,(AssertionResult *)"foo_->is_repeated()","true",
                     "false",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_38,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                     ,0x4d1,(char *)CONCAT44(local_30._M_dataplus._M_p._4_4_,
                                             (int)local_30._M_dataplus._M_p));
          testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_50);
          testing::internal::AssertHelper::~AssertHelper(&local_38);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_30._M_dataplus._M_p._4_4_,(int)local_30._M_dataplus._M_p) !=
              &local_30.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_30._M_dataplus._M_p._4_4_,(int)local_30._M_dataplus._M_p)
                            ,local_30.field_2._M_allocated_capacity + 1);
          }
          if ((long *)CONCAT44(local_50.data_._4_4_,local_50.data_._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_50.data_._4_4_,local_50.data_._0_4_) + 8))();
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40.payload_
              != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)this_00,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_40.payload_);
          }
        }
        bVar2 = FieldDescriptor::is_required((this->super_DescriptorTest).bar_);
        local_48[0] = !bVar2;
        local_40.payload_ = (char *)0x0;
        if (!(bool)local_48[0]) {
          this_00 = (FieldDescriptor *)&local_40;
          testing::Message::Message((Message *)&local_50);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_30,(internal *)local_48,(AssertionResult *)"bar_->is_required()","true",
                     "false",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_38,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                     ,0x4d3,(char *)CONCAT44(local_30._M_dataplus._M_p._4_4_,
                                             (int)local_30._M_dataplus._M_p));
          testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_50);
          testing::internal::AssertHelper::~AssertHelper(&local_38);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_30._M_dataplus._M_p._4_4_,(int)local_30._M_dataplus._M_p) !=
              &local_30.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_30._M_dataplus._M_p._4_4_,(int)local_30._M_dataplus._M_p)
                            ,local_30.field_2._M_allocated_capacity + 1);
          }
          if ((long *)CONCAT44(local_50.data_._4_4_,local_50.data_._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_50.data_._4_4_,local_50.data_._0_4_) + 8))();
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40.payload_
              != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)this_00,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_40.payload_);
          }
        }
        local_48[0] = (((this->super_DescriptorTest).bar_)->field_0x1 & 0xc0) == 0x40;
        local_40.payload_ = (char *)0x0;
        if (!(bool)local_48[0]) {
          this_00 = (FieldDescriptor *)&local_40;
          testing::Message::Message((Message *)&local_50);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_30,(internal *)local_48,(AssertionResult *)"bar_->is_optional()","false"
                     ,"true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_38,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                     ,0x4d4,(char *)CONCAT44(local_30._M_dataplus._M_p._4_4_,
                                             (int)local_30._M_dataplus._M_p));
          testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_50);
          testing::internal::AssertHelper::~AssertHelper(&local_38);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_30._M_dataplus._M_p._4_4_,(int)local_30._M_dataplus._M_p) !=
              &local_30.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_30._M_dataplus._M_p._4_4_,(int)local_30._M_dataplus._M_p)
                            ,local_30.field_2._M_allocated_capacity + 1);
          }
          if ((long *)CONCAT44(local_50.data_._4_4_,local_50.data_._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_50.data_._4_4_,local_50.data_._0_4_) + 8))();
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40.payload_
              != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)this_00,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_40.payload_);
          }
        }
        bVar1 = ((this->super_DescriptorTest).bar_)->field_0x1;
        if (0xbf < bVar1 != (bool)((bVar1 & 0x20) >> 5)) goto LAB_00578e3f;
        local_48[0] = (bVar1 & 0x20) == 0;
        local_40.payload_ = (char *)0x0;
        if (!(bool)local_48[0]) {
          this_00 = (FieldDescriptor *)&local_40;
          testing::Message::Message((Message *)&local_50);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_30,(internal *)local_48,(AssertionResult *)"bar_->is_repeated()","true",
                     "false",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_38,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                     ,0x4d5,(char *)CONCAT44(local_30._M_dataplus._M_p._4_4_,
                                             (int)local_30._M_dataplus._M_p));
          testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_50);
          testing::internal::AssertHelper::~AssertHelper(&local_38);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_30._M_dataplus._M_p._4_4_,(int)local_30._M_dataplus._M_p) !=
              &local_30.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_30._M_dataplus._M_p._4_4_,(int)local_30._M_dataplus._M_p)
                            ,local_30.field_2._M_allocated_capacity + 1);
          }
          if ((long *)CONCAT44(local_50.data_._4_4_,local_50.data_._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_50.data_._4_4_,local_50.data_._0_4_) + 8))();
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40.payload_
              != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)this_00,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_40.payload_);
          }
        }
        bVar2 = FieldDescriptor::is_required((this->super_DescriptorTest).baz_);
        local_48[0] = !bVar2;
        local_40.payload_ = (char *)0x0;
        if (!(bool)local_48[0]) {
          this_00 = (FieldDescriptor *)&local_40;
          testing::Message::Message((Message *)&local_50);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_30,(internal *)local_48,(AssertionResult *)"baz_->is_required()","true",
                     "false",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_38,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                     ,0x4d7,(char *)CONCAT44(local_30._M_dataplus._M_p._4_4_,
                                             (int)local_30._M_dataplus._M_p));
          testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_50);
          testing::internal::AssertHelper::~AssertHelper(&local_38);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_30._M_dataplus._M_p._4_4_,(int)local_30._M_dataplus._M_p) !=
              &local_30.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_30._M_dataplus._M_p._4_4_,(int)local_30._M_dataplus._M_p)
                            ,local_30.field_2._M_allocated_capacity + 1);
          }
          if ((long *)CONCAT44(local_50.data_._4_4_,local_50.data_._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_50.data_._4_4_,local_50.data_._0_4_) + 8))();
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40.payload_
              != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)this_00,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_40.payload_);
          }
        }
        local_48[0] = (((this->super_DescriptorTest).baz_)->field_0x1 & 0xc0) != 0x40;
        local_40.payload_ = (char *)0x0;
        if (!(bool)local_48[0]) {
          this_00 = (FieldDescriptor *)&local_40;
          testing::Message::Message((Message *)&local_50);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_30,(internal *)local_48,(AssertionResult *)"baz_->is_optional()","true",
                     "false",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_38,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                     ,0x4d8,(char *)CONCAT44(local_30._M_dataplus._M_p._4_4_,
                                             (int)local_30._M_dataplus._M_p));
          testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_50);
          testing::internal::AssertHelper::~AssertHelper(&local_38);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_30._M_dataplus._M_p._4_4_,(int)local_30._M_dataplus._M_p) !=
              &local_30.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_30._M_dataplus._M_p._4_4_,(int)local_30._M_dataplus._M_p)
                            ,local_30.field_2._M_allocated_capacity + 1);
          }
          if ((long *)CONCAT44(local_50.data_._4_4_,local_50.data_._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_50.data_._4_4_,local_50.data_._0_4_) + 8))();
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40.payload_
              != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)this_00,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_40.payload_);
          }
        }
        bVar1 = ((this->super_DescriptorTest).baz_)->field_0x1;
        bVar3 = bVar1 & 0x20;
        iVar5 = (internal)(bVar3 >> 5);
        if ((internal)(0xbf < bVar1) == iVar5) {
          local_40.payload_ = (char *)0x0;
          if (bVar3 == 0) {
            local_48[0] = (uint8_t)iVar5;
            testing::Message::Message((Message *)&local_50);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_30,(internal *)local_48,(AssertionResult *)"baz_->is_repeated()",
                       "false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_38,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                       ,0x4d9,(char *)CONCAT44(local_30._M_dataplus._M_p._4_4_,
                                               (int)local_30._M_dataplus._M_p));
            testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_50);
            testing::internal::AssertHelper::~AssertHelper(&local_38);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_30._M_dataplus._M_p._4_4_,(int)local_30._M_dataplus._M_p) !=
                &local_30.field_2) {
              operator_delete((undefined1 *)
                              CONCAT44(local_30._M_dataplus._M_p._4_4_,
                                       (int)local_30._M_dataplus._M_p),
                              local_30.field_2._M_allocated_capacity + 1);
            }
            if ((long *)CONCAT44(local_50.data_._4_4_,local_50.data_._0_4_) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT44(local_50.data_._4_4_,local_50.data_._0_4_) + 8))();
            }
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_40.payload_ !=
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              std::
              default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_40,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_40.payload_);
            }
          }
          return;
        }
      }
      else {
        TestBody();
LAB_00578e3f:
        TestBody();
      }
      TestBody();
      goto LAB_00578e6e;
    }
    bVar2 = (bool)((this_00->field_0x1 & 0x20) >> 5);
    if (0xbf < (byte)this_00->field_0x1 == bVar2) {
      iVar4 = (uint)bVar2 * 2 + 1;
      goto LAB_00578537;
    }
  }
  else {
    bVar2 = (bool)((this_00->field_0x1 & 0x20) >> 5);
    if (0xbf < (byte)this_00->field_0x1 == bVar2) {
      iVar4 = (uint)bVar2 * 2 + 1;
      goto LAB_00578365;
    }
LAB_00578e6e:
    TestBody();
LAB_00578e84:
    TestBody();
  }
  TestBody();
LAB_00578eb0:
  TestBody();
  testing::internal::AssertHelper::~AssertHelper(&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_30._M_dataplus._M_p._4_4_,(int)local_30._M_dataplus._M_p) !=
      &local_30.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_30._M_dataplus._M_p._4_4_,(int)local_30._M_dataplus._M_p),
                    local_30.field_2._M_allocated_capacity + 1);
  }
  if ((long *)CONCAT44(local_50.data_._4_4_,local_50.data_._0_4_) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(local_50.data_._4_4_,local_50.data_._0_4_) + 8))();
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40.payload_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)this_00,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_40.payload_);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

TEST_F(DescriptorTest, FieldLabel) {
  EXPECT_EQ(FieldDescriptor::LABEL_REQUIRED, foo_->label());
  EXPECT_EQ(FieldDescriptor::LABEL_OPTIONAL, bar_->label());
  EXPECT_EQ(FieldDescriptor::LABEL_REPEATED, baz_->label());
  EXPECT_EQ(FieldDescriptor::LABEL_OPTIONAL, moo_->label());

  EXPECT_TRUE(foo_->is_required());
  EXPECT_FALSE(foo_->is_optional());
  EXPECT_FALSE(foo_->is_repeated());

  EXPECT_FALSE(bar_->is_required());
  EXPECT_TRUE(bar_->is_optional());
  EXPECT_FALSE(bar_->is_repeated());

  EXPECT_FALSE(baz_->is_required());
  EXPECT_FALSE(baz_->is_optional());
  EXPECT_TRUE(baz_->is_repeated());
}